

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

int rtr_mgr_init(rtr_mgr_config **config_out,rtr_mgr_group *groups,uint groups_len,
                rtr_mgr_status_fp status_fp,void *status_fp_data)

{
  long lVar1;
  int iVar2;
  rtr_mgr_config *ptr;
  ulong uVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t uVar6;
  char *frmt;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *config_out = (rtr_mgr_config *)0x0;
  if (groups_len == 0) {
    lrtr_dbg("RTR_MGR: Error Empty rtr_mgr_group array");
    iVar4 = -1;
  }
  else {
    ptr = (rtr_mgr_config *)lrtr_malloc(0x70);
    *config_out = ptr;
    iVar4 = -1;
    if (ptr != (rtr_mgr_config *)0x0) {
      ptr->len = groups_len;
      iVar2 = pthread_rwlock_init((pthread_rwlock_t *)&ptr->mutex,(pthread_rwlockattr_t *)0x0);
      if (iVar2 == 0) {
        qsort(groups,(ulong)groups_len,0x18,rtr_mgr_config_cmp);
        puVar5 = &groups->preference;
        uVar6 = 0xff;
        for (uVar3 = 0; uVar3 < ptr->len; uVar3 = uVar3 + 1) {
          if (((uVar3 != 0) &&
              (frmt = "RTR_MGR: Error Same preference for 2 socket groups!", *puVar5 == uVar6)) ||
             (frmt = "RTR_MGR: Error Empty sockets array in socket group!",
             *(uint *)(puVar5 + -4) == 0)) goto LAB_0010587c;
          uVar6 = *puVar5;
          puVar5 = puVar5 + 0x18;
        }
        ptr->status_fp_data = status_fp_data;
        ptr->status_fp = status_fp;
        iVar4 = 0;
      }
      else {
        frmt = "RTR_MGR: Mutex initialization failed";
LAB_0010587c:
        lrtr_dbg(frmt);
        lrtr_free(ptr->groups);
        lrtr_free(ptr);
        *config_out = (rtr_mgr_config *)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_init(struct rtr_mgr_config **config_out, struct rtr_mgr_group groups[],
			       const unsigned int groups_len, const rtr_mgr_status_fp status_fp, void *status_fp_data)
{
	enum rtr_rtvals err_code = RTR_ERROR;
	struct rtr_mgr_config *config = NULL;
	uint8_t last_preference = UINT8_MAX;

	*config_out = NULL;

	if (groups_len == 0) {
		MGR_DBG1("Error Empty rtr_mgr_group array");
		return RTR_ERROR;
	}

	*config_out = config = lrtr_malloc(sizeof(*config));
	if (!config)
		return RTR_ERROR;

	config->len = groups_len;

	if (pthread_rwlock_init(&config->mutex, NULL) != 0) {
		MGR_DBG1("Mutex initialization failed");
		goto err;
	}
	/* sort array in asc order, so we can check for dupl. pref */
	qsort(groups, groups_len, sizeof(struct rtr_mgr_group), &rtr_mgr_config_cmp);

	/* Check that the groups have unique pref and at least one socket */
	for (unsigned int i = 0; i < config->len; i++) {
		if ((i > 0) && (groups[i].preference == last_preference)) {
			MGR_DBG1("Error Same preference for 2 socket groups!");
			goto err;
		}
		if (groups[i].sockets_len == 0) {
			MGR_DBG1("Error Empty sockets array in socket group!");
			goto err;
		}

		last_preference = groups[i].preference;
	}

	config->status_fp_data = status_fp_data;
	config->status_fp = status_fp;
	return RTR_SUCCESS;

err:
	lrtr_free(config->groups);
	lrtr_free(config);
	config = NULL;
	*config_out = NULL;

	return err_code;
}